

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupMockPlugin::~TEST_GROUP_CppUTestGroupMockPlugin
          (TEST_GROUP_CppUTestGroupMockPlugin *this)

{
  ~TEST_GROUP_CppUTestGroupMockPlugin(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

TEST_GROUP(MockPlugin)
{
    StringBufferTestOutput output;

    UtestShell *test;
    TestResult *result;

    MockSupportPlugin plugin;

    void setup() _override
    {
        test = new UtestShell("group", "name", "file", 1);
        result = new TestResult(output);
    }

    void teardown() _override
    {
        delete test;
        delete result;
        mock().clear();
        mock().removeAllComparatorsAndCopiers();
    }
}